

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O1

Error __thiscall
asmjit::String::_opHex(String *this,uint32_t op,void *data,size_t size,char separator)

{
  char *pcVar1;
  size_t sVar2;
  
  if (size != 0) {
    if (separator == '\0') {
      if (0x7ffffffffffffffe < size) {
        return 1;
      }
      pcVar1 = prepare(this,op,size * 2);
      if (pcVar1 == (char *)0x0) {
        return 1;
      }
      sVar2 = 0;
      do {
        pcVar1[sVar2 * 2] =
             "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ"[*(byte *)((long)data + sVar2) >> 4];
        pcVar1[sVar2 * 2 + 1] =
             "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ"[*(byte *)((long)data + sVar2) & 0xf];
        sVar2 = sVar2 + 1;
      } while (size != sVar2);
      return 0;
    }
    if (0x5555555555555554 < size) {
      return 1;
    }
    pcVar1 = prepare(this,op,size * 3 - 1);
    if (pcVar1 == (char *)0x0) {
      return 1;
    }
    *pcVar1 = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ"[*data >> 4];
    pcVar1[1] = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ"[*data & 0xf];
    if (size != 1) {
      pcVar1 = pcVar1 + 4;
      sVar2 = 1;
      do {
        pcVar1[-2] = separator;
        pcVar1[-1] = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ"[*(byte *)((long)data + sVar2) >> 4];
        *pcVar1 = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ"[*(byte *)((long)data + sVar2) & 0xf];
        sVar2 = sVar2 + 1;
        pcVar1 = pcVar1 + 3;
      } while (size != sVar2);
    }
  }
  return 0;
}

Assistant:

Error String::_opHex(uint32_t op, const void* data, size_t size, char separator) noexcept {
  char* dst;
  const uint8_t* src = static_cast<const uint8_t*>(data);

  if (!size)
    return kErrorOk;

  if (separator) {
    if (ASMJIT_UNLIKELY(size >= SIZE_MAX / 3))
      return DebugUtils::errored(kErrorOutOfMemory);

    dst = prepare(op, size * 3 - 1);
    if (ASMJIT_UNLIKELY(!dst))
      return DebugUtils::errored(kErrorOutOfMemory);

    size_t i = 0;
    for (;;) {
      dst[0] = String_baseN[(src[0] >> 4) & 0xF];
      dst[1] = String_baseN[(src[0]     ) & 0xF];
      if (++i == size)
        break;
      // This makes sure that the separator is only put between two hexadecimal bytes.
      dst[2] = separator;
      dst += 3;
      src++;
    }
  }
  else {
    if (ASMJIT_UNLIKELY(size >= SIZE_MAX / 2))
      return DebugUtils::errored(kErrorOutOfMemory);

    dst = prepare(op, size * 2);
    if (ASMJIT_UNLIKELY(!dst))
      return DebugUtils::errored(kErrorOutOfMemory);

    for (size_t i = 0; i < size; i++, dst += 2, src++) {
      dst[0] = String_baseN[(src[0] >> 4) & 0xF];
      dst[1] = String_baseN[(src[0]     ) & 0xF];
    }
  }

  return kErrorOk;
}